

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O0

PaError AlsaStop(PaAlsaStream *stream,int abort)

{
  int iVar1;
  int iVar2;
  pthread_t pVar3;
  char *pcVar4;
  int __pa_unsure_error_id_2;
  int __pa_unsure_error_id_1;
  int __pa_unsure_error_id;
  PaError result;
  int abort_local;
  PaAlsaStream *stream_local;
  
  if (((stream->playback).pcm == (snd_pcm_t *)0x0) ||
     (iVar1 = (*(code *)alsa_snd_pcm_drop)((stream->playback).pcm), -1 < iVar1)) {
    if ((stream->capture).pcm == (snd_pcm_t *)0x0) {
      return 0;
    }
    if (stream->pcmsSynced != 0) {
      return 0;
    }
    iVar1 = (*(code *)alsa_snd_pcm_drop)((stream->capture).pcm);
    if (-1 < iVar1) {
      return 0;
    }
    pVar3 = pthread_self();
    iVar2 = pthread_equal(pVar3,paUnixMainThread);
    if (iVar2 != 0) {
      pcVar4 = (*alsa_snd_strerror)(iVar1);
      PaUtil_SetLastHostErrorInfo(paALSA,(long)iVar1,pcVar4);
    }
    PaUtil_DebugPrint(
                     "Expression \'alsa_snd_pcm_drop( stream->capture.pcm )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 3041\n"
                     );
  }
  else {
    pVar3 = pthread_self();
    iVar2 = pthread_equal(pVar3,paUnixMainThread);
    if (iVar2 != 0) {
      pcVar4 = (*alsa_snd_strerror)(iVar1);
      PaUtil_SetLastHostErrorInfo(paALSA,(long)iVar1,pcVar4);
    }
    PaUtil_DebugPrint(
                     "Expression \'alsa_snd_pcm_drop( stream->playback.pcm )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 3037\n"
                     );
  }
  return -9999;
}

Assistant:

static PaError AlsaStop( PaAlsaStream *stream, int abort )
{
    PaError result = paNoError;
    /* XXX: alsa_snd_pcm_drain tends to lock up, avoid it until we find out more */
    abort = 1;
    /*
    if( stream->capture.pcm && !strcmp( Pa_GetDeviceInfo( stream->capture.device )->name,
                "dmix" ) )
    {
        abort = 1;
    }
    else if( stream->playback.pcm && !strcmp( Pa_GetDeviceInfo( stream->playback.device )->name,
                "dmix" ) )
    {
        abort = 1;
    }
    */

    if( abort )
    {
        if( stream->playback.pcm )
        {
            ENSURE_( alsa_snd_pcm_drop( stream->playback.pcm ), paUnanticipatedHostError );
        }
        if( stream->capture.pcm && !stream->pcmsSynced )
        {
            ENSURE_( alsa_snd_pcm_drop( stream->capture.pcm ), paUnanticipatedHostError );
        }

        PA_DEBUG(( "%s: Dropped frames\n", __FUNCTION__ ));
    }
    else
    {
        if( stream->playback.pcm )
        {
            ENSURE_( alsa_snd_pcm_nonblock( stream->playback.pcm, 0 ), paUnanticipatedHostError );
            if( alsa_snd_pcm_drain( stream->playback.pcm ) < 0 )
            {
                PA_DEBUG(( "%s: Draining playback handle failed!\n", __FUNCTION__ ));
            }
        }
        if( stream->capture.pcm && !stream->pcmsSynced )
        {
            /* We don't need to retrieve any remaining frames */
            if( alsa_snd_pcm_drain( stream->capture.pcm ) < 0 )
            {
                PA_DEBUG(( "%s: Draining capture handle failed!\n", __FUNCTION__ ));
            }
        }
    }

end:
    return result;
error:
    goto end;
}